

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dense_rankValueFunc(sqlite3_context *pCtx)

{
  long *plVar1;
  CallCount *p;
  sqlite3_context *pCtx_local;
  
  plVar1 = (long *)sqlite3_aggregate_context(pCtx,0x18);
  if (plVar1 != (long *)0x0) {
    if (plVar1[1] != 0) {
      *plVar1 = *plVar1 + 1;
      plVar1[1] = 0;
    }
    sqlite3_result_int64(pCtx,*plVar1);
  }
  return;
}

Assistant:

static void dense_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nStep ){
      p->nValue++;
      p->nStep = 0;
    }
    sqlite3_result_int64(pCtx, p->nValue);
  }
}